

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

void __thiscall tetgenmesh::makeshellface(tetgenmesh *this,memorypool *pool,face *newface)

{
  shellface *pppdVar1;
  
  pppdVar1 = (shellface *)memorypool::alloc(pool);
  newface->sh = pppdVar1;
  *pppdVar1 = (shellface)0x0;
  newface->sh[1] = (shellface)0x0;
  newface->sh[2] = (shellface)0x0;
  newface->sh[3] = (shellface)0x0;
  newface->sh[4] = (shellface)0x0;
  newface->sh[5] = (shellface)0x0;
  newface->sh[6] = (shellface)0x0;
  newface->sh[7] = (shellface)0x0;
  newface->sh[8] = (shellface)0x0;
  newface->sh[9] = (shellface)0x0;
  newface->sh[10] = (shellface)0x0;
  if (this->checkconstraints != 0) {
    newface->sh[this->areaboundindex] = (shellface)0x0;
  }
  pppdVar1 = newface->sh;
  *(undefined4 *)((long)pppdVar1 + (long)this->shmarkindex * 4) = 0;
  *(undefined4 *)((long)pppdVar1 + (long)this->shmarkindex * 4 + 4) = 0;
  if (this->useinsertradius != 0) {
    *(undefined4 *)((long)pppdVar1 + (long)this->shmarkindex * 4 + 8) = 0;
  }
  newface->shver = 0;
  return;
}

Assistant:

void tetgenmesh::makeshellface(memorypool *pool, face *newface)
{
  newface->sh = (shellface *) pool->alloc();

  // No adjointing subfaces.
  newface->sh[0] = NULL;
  newface->sh[1] = NULL;
  newface->sh[2] = NULL;
  // Three NULL vertices.
  newface->sh[3] = NULL;
  newface->sh[4] = NULL;
  newface->sh[5] = NULL;
  // No adjoining subsegments.
  newface->sh[6] = NULL;
  newface->sh[7] = NULL;
  newface->sh[8] = NULL;
  // No adjoining tetrahedra.
  newface->sh[9] = NULL;
  newface->sh[10] = NULL;
  if (checkconstraints) {
    // Initialize the maximum area bound.
    setareabound(*newface, 0.0);
  }
  // Set the boundary marker to zero.
  setshellmark(*newface, 0);
  // Clear the infection and marktest bits.
  ((int *) (newface->sh))[shmarkindex + 1] = 0;
  if (useinsertradius) {
    setfacetindex(*newface, 0);
  }

  newface->shver = 0;
}